

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O2

void __thiscall ApprovalTests::Linux::KDiff3Reporter::KDiff3Reporter(KDiff3Reporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Linux::KDIFF3();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_0019f980;
  return;
}

Assistant:

KDiff3Reporter::KDiff3Reporter()
            : GenericDiffReporter(DiffPrograms::Linux::KDIFF3())
        {
        }